

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTypes::visit(SemanticTypes *this,ArrayCallNode *arrayCallNode)

{
  ExpNode *pEVar1;
  
  pEVar1 = arrayCallNode->exp;
  if (pEVar1 == (ExpNode *)0x0) {
    visit((SemanticTypes *)arrayCallNode);
  }
  else {
    (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
    pEVar1 = arrayCallNode->index;
    if (pEVar1 == (ExpNode *)0x0) {
      visit((SemanticTypes *)arrayCallNode);
    }
    else {
      (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
      pEVar1 = arrayCallNode->exp;
      if (pEVar1->arraySize < 0) {
        visit((SemanticTypes *)arrayCallNode);
      }
      else if (arrayCallNode->index->type == 0xb) {
        (arrayCallNode->super_ExpNode).type = pEVar1->type;
        (arrayCallNode->super_ExpNode).typeLexeme = pEVar1->typeLexeme;
        (arrayCallNode->super_ExpNode).pointer = pEVar1->pointer;
        (arrayCallNode->super_ExpNode).arraySize = -1;
      }
      else {
        visit((SemanticTypes *)arrayCallNode);
      }
    }
  }
  return;
}

Assistant:

void SemanticTypes::visit(ArrayCallNode *arrayCallNode) {
    if (arrayCallNode->getExp()) {
        arrayCallNode->getExp()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - arrayCallNode] INVALID ARRAY ACCESS EXPRESSION, line %d\n",
                arrayCallNode->getLine());
        return;
    }

    if (arrayCallNode->getIndex()) {
        arrayCallNode->getIndex()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - arrayCallNode] INVALID ARRAY INDEX EXPRESSION, line %d\n",
                arrayCallNode->getLine());
        return;
    }

    if (arrayCallNode->getExp()->getArraySize() < 0) {
        fprintf(stderr, "[SEMANTIC ERROR - arrayCallNode] ARRAY ACCESS TO A NON ARRAY TYPE, line %d\n",
                arrayCallNode->getLine());
        return;
    }


    if (arrayCallNode->getIndex()->getType() != INT) {
        fprintf(stderr, "[SEMANTIC ERROR - arrayCallNode] ARRAY ACCESS WITH NON INT EXPRESSION, line %d -type: %s\n",
                arrayCallNode->getLine(), arrayCallNode->getTypeLexeme());
        return;
    }

    //Set node type to the single element type
    arrayCallNode->setType(arrayCallNode->getExp()->getType());
    arrayCallNode->setTypeLexeme(arrayCallNode->getExp()->getTypeLexeme());
    arrayCallNode->setPointer(arrayCallNode->getExp()->isPointer());
    arrayCallNode->setArraySize(-1);
}